

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gemm_x86.cpp
# Opt level: O3

void ncnn::pack_A_tile(Mat *A,Mat *AT,int i,int max_ii,int k,int max_kk)

{
  void **ppvVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  int *piVar13;
  undefined8 uVar14;
  Mat *pMVar15;
  size_t *psVar16;
  long lVar17;
  undefined1 (*pauVar18) [32];
  void *pvVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  Mat *pMVar23;
  long lVar24;
  long lVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  undefined1 (*pauVar29) [16];
  ulong uVar30;
  long lVar31;
  long lVar32;
  int iVar33;
  uint uVar34;
  long lVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  long lVar39;
  long lVar40;
  long lVar41;
  undefined1 (*pauVar42) [16];
  uint uVar43;
  long lVar44;
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  long local_b8;
  long local_b0;
  long local_a8;
  long local_90;
  long local_88;
  long local_80;
  long local_50;
  long local_48;
  
  iVar33 = A->elempack;
  psVar16 = (size_t *)&A->w;
  if (A->dims == 3) {
    psVar16 = &A->cstep;
  }
  uVar30 = 0;
  lVar35 = (long)k;
  lVar38 = (long)i;
  lVar37 = (long)(int)*psVar16;
  if (7 < max_ii) {
    lVar17 = (long)(k * 4) * 4;
    lVar28 = lVar17 + lVar37 * lVar38 * 4;
    lVar40 = lVar37 * 0x20;
    lVar27 = (lVar38 + 4) * lVar37;
    lVar17 = lVar17 + lVar27 * 4;
    local_50 = lVar35 * 4;
    local_b0 = local_50 + lVar37 * lVar38 * 4;
    local_b8 = local_50 + (lVar38 + 1) * lVar37 * 4;
    local_a8 = local_50 + (lVar38 + 2) * lVar37 * 4;
    local_80 = local_50 + (lVar38 + 3) * lVar37 * 4;
    local_88 = local_50 + lVar27 * 4;
    local_90 = local_50 + (lVar38 + 7) * lVar37 * 4;
    local_48 = local_50 + (lVar38 + 6) * lVar37 * 4;
    local_50 = local_50 + (lVar38 + 5) * lVar37 * 4;
    uVar26 = 0;
    do {
      if (iVar33 == 8) {
        if (0 < max_kk) {
          pauVar18 = (undefined1 (*) [32])
                     ((long)A->data + (long)(k * 8) * 4 + (lVar38 + uVar26) * lVar37 * 4);
          iVar22 = max_kk;
          do {
            *(undefined1 (*) [32])AT = *pauVar18;
            AT = (Mat *)&AT->allocator;
            pauVar18 = pauVar18 + 1;
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
          goto LAB_004cf346;
        }
      }
      else {
LAB_004cf346:
        if (iVar33 == 4) {
          if (max_kk < 1) goto LAB_004cf67f;
          pvVar19 = A->data;
          iVar22 = max_kk;
          do {
            piVar13 = (int *)((undefined8 *)((long)pvVar19 + lVar28))[1];
            AT->data = *(void **)((long)pvVar19 + lVar28);
            AT->refcount = piVar13;
            *(undefined1 (*) [16])&AT->elemsize = *(undefined1 (*) [16])((long)pvVar19 + lVar17);
            AT = (Mat *)&AT->allocator;
            pvVar19 = (void *)((long)pvVar19 + 0x10);
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
        }
        if (iVar33 == 1) {
          pvVar19 = A->data;
          if (max_kk < 8) {
            lVar27 = lVar35 * 4 + (lVar38 + uVar26) * lVar37 * 4;
            lVar41 = lVar35 * 4 + (lVar38 + uVar26 + 1) * lVar37 * 4;
            lVar24 = lVar35 * 4 + (lVar38 + uVar26 + 2) * lVar37 * 4;
            lVar25 = lVar35 * 4 + (lVar38 + uVar26 + 3) * lVar37 * 4;
            lVar31 = lVar35 * 4 + (lVar38 + uVar26 + 4) * lVar37 * 4;
            lVar32 = lVar35 * 4 + (lVar38 + uVar26 + 5) * lVar37 * 4;
            lVar21 = lVar35 * 4 + (lVar38 + uVar26 + 6) * lVar37 * 4;
            lVar39 = lVar35 * 4 + (uVar26 + lVar38 + 7) * lVar37 * 4;
            uVar43 = 0;
          }
          else {
            iVar22 = 7;
            lVar32 = 0;
            pMVar15 = AT;
            do {
              pMVar23 = pMVar15;
              ppvVar1 = &AT->data + lVar32;
              lVar27 = lVar32 + local_b0;
              auVar2 = *(undefined1 (*) [32])((long)pvVar19 + lVar32 + local_b0);
              lVar41 = lVar37 * 8 + lVar27;
              auVar45 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 4 + lVar27);
              auVar46 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 8 + lVar27);
              auVar3 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 4 + lVar41);
              lVar27 = lVar37 * 8 + lVar41;
              auVar4 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 8 + lVar41);
              lVar41 = lVar37 * 4 + lVar27;
              auVar47 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 4 + lVar27);
              auVar5 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 4 + lVar41);
              auVar6 = *(undefined1 (*) [32])((long)pvVar19 + lVar37 * 8 + lVar41);
              auVar12 = vunpcklps_avx(auVar2,auVar45);
              auVar45 = vunpckhps_avx(auVar2,auVar45);
              auVar2 = vunpcklps_avx(auVar46,auVar3);
              auVar46 = vunpckhps_avx(auVar46,auVar3);
              auVar48 = vunpcklps_avx(auVar4,auVar47);
              auVar3 = vunpckhps_avx(auVar4,auVar47);
              auVar49 = vunpcklps_avx(auVar5,auVar6);
              auVar4 = vunpckhps_avx(auVar5,auVar6);
              auVar47 = vunpcklpd_avx(auVar12,auVar2);
              auVar2 = vunpckhpd_avx(auVar12,auVar2);
              auVar5 = vunpcklpd_avx(auVar45,auVar46);
              auVar45 = vunpckhpd_avx(auVar45,auVar46);
              auVar6 = vunpcklpd_avx(auVar48,auVar49);
              auVar46 = vunpckhpd_avx(auVar48,auVar49);
              auVar12 = vunpcklpd_avx(auVar3,auVar4);
              auVar3 = vunpckhpd_avx(auVar3,auVar4);
              auVar48._16_16_ = auVar6._0_16_;
              auVar48._0_16_ = auVar47._0_16_;
              auVar49._16_16_ = auVar46._0_16_;
              auVar49._0_16_ = auVar2._0_16_;
              auVar50._16_16_ = auVar12._0_16_;
              auVar50._0_16_ = auVar5._0_16_;
              auVar51._16_16_ = auVar3._0_16_;
              auVar51._0_16_ = auVar45._0_16_;
              auVar4 = vperm2f128_avx(auVar47,auVar6,0x31);
              auVar2 = vperm2f128_avx(auVar2,auVar46,0x31);
              auVar46 = vperm2f128_avx(auVar5,auVar12,0x31);
              auVar45 = vperm2f128_avx(auVar45,auVar3,0x31);
              *(undefined1 (*) [32])ppvVar1 = auVar48;
              *(undefined1 (*) [32])(ppvVar1 + 4) = auVar49;
              *(undefined1 (*) [32])(ppvVar1 + 8) = auVar50;
              *(undefined1 (*) [32])(ppvVar1 + 0xc) = auVar51;
              *(undefined1 (*) [32])(ppvVar1 + 0x10) = auVar4;
              *(undefined1 (*) [32])(ppvVar1 + 0x14) = auVar2;
              *(undefined1 (*) [32])(ppvVar1 + 0x18) = auVar46;
              *(undefined1 (*) [32])(ppvVar1 + 0x1c) = auVar45;
              lVar32 = lVar32 + 0x20;
              iVar22 = iVar22 + 8;
              pMVar15 = (Mat *)(ppvVar1 + 0x20);
            } while (iVar22 < max_kk);
            AT = (Mat *)&pMVar23[3].dims;
            lVar27 = lVar32 + local_b0;
            lVar41 = lVar32 + local_b8;
            lVar24 = lVar32 + local_a8;
            lVar25 = lVar32 + local_80;
            lVar31 = lVar32 + local_88;
            lVar39 = lVar32 + local_90;
            lVar21 = lVar32 + local_48;
            lVar32 = lVar32 + local_50;
            uVar43 = max_kk & 0xfffffff8;
          }
          iVar22 = max_kk - uVar43;
          if (iVar22 != 0 && (int)uVar43 <= max_kk) {
            lVar44 = 0;
            lVar36 = 0;
            do {
              *(undefined4 *)(&AT->data + lVar36) = *(undefined4 *)((long)pvVar19 + lVar36 + lVar27)
              ;
              *(undefined4 *)((long)&AT->data + lVar36 * 8 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar41);
              *(undefined4 *)(&AT->refcount + lVar36) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar24);
              *(undefined4 *)((long)&AT->refcount + lVar36 * 8 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar25);
              *(undefined4 *)(&AT->elemsize + lVar36) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar31);
              *(undefined4 *)((long)&AT->elemsize + lVar36 * 8 + 4) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar32);
              (&AT->elempack)[lVar36 * 2] = *(int *)((long)pvVar19 + lVar36 + lVar21);
              *(undefined4 *)(&AT->field_0x1c + lVar36 * 8) =
                   *(undefined4 *)((long)pvVar19 + lVar36 + lVar39);
              lVar36 = lVar36 + 4;
              lVar44 = lVar44 + -0x20;
              iVar22 = iVar22 + -1;
            } while (iVar22 != 0);
            AT = (Mat *)((long)AT - lVar44);
          }
        }
      }
LAB_004cf67f:
      uVar30 = uVar26 + 8;
      uVar20 = uVar26 + 0xf;
      lVar28 = lVar28 + lVar40;
      lVar17 = lVar17 + lVar40;
      local_b0 = local_b0 + lVar40;
      local_b8 = local_b8 + lVar40;
      local_a8 = local_a8 + lVar40;
      local_80 = local_80 + lVar40;
      local_88 = local_88 + lVar40;
      local_90 = local_90 + lVar40;
      local_48 = local_48 + lVar40;
      local_50 = local_50 + lVar40;
      uVar26 = uVar30;
    } while (uVar20 < (uint)max_ii);
  }
  lVar28 = (long)max_ii;
  if ((int)((uint)uVar30 | 3) < max_ii) {
    uVar26 = uVar30 & 0xffffffff;
    lVar41 = lVar35 * 4;
    lVar17 = lVar41 + (lVar38 + uVar26 + 3) * lVar37 * 4;
    lVar24 = lVar37 * 0x10;
    lVar27 = lVar41 + (lVar38 + uVar26 + 2) * lVar37 * 4;
    lVar40 = lVar41 + (lVar38 + uVar26 + 1) * lVar37 * 4;
    lVar41 = lVar41 + (lVar38 + uVar26) * lVar37 * 4;
    do {
      if (iVar33 == 4) {
        if (0 < max_kk) {
          pauVar29 = (undefined1 (*) [16])
                     ((long)A->data + (long)(k * 4) * 4 + (uVar26 + lVar38) * lVar37 * 4);
          iVar22 = max_kk;
          do {
            *(undefined1 (*) [16])AT = *pauVar29;
            AT = (Mat *)&AT->elemsize;
            pauVar29 = pauVar29 + 1;
            iVar22 = iVar22 + -1;
          } while (iVar22 != 0);
          goto LAB_004cf78f;
        }
      }
      else {
LAB_004cf78f:
        if (iVar33 == 1) {
          pvVar19 = A->data;
          if (max_kk < 8) {
            uVar43 = 0;
            lVar21 = lVar35 * 4 + (uVar26 + lVar38) * lVar37 * 4;
            lVar39 = lVar35 * 4 + (uVar26 + lVar38 + 1) * lVar37 * 4;
            lVar31 = lVar35 * 4 + (uVar26 + lVar38 + 2) * lVar37 * 4;
            lVar25 = lVar35 * 4 + (uVar26 + lVar38 + 3) * lVar37 * 4;
          }
          else {
            iVar22 = 7;
            lVar21 = 0;
            pMVar15 = AT;
            do {
              pMVar23 = pMVar15;
              pauVar18 = (undefined1 (*) [32])((long)&AT->data + lVar21 * 4);
              auVar2 = *(undefined1 (*) [32])((long)pvVar19 + lVar21 + lVar41);
              auVar45 = *(undefined1 (*) [32])((long)pvVar19 + lVar21 + lVar40);
              auVar46 = *(undefined1 (*) [32])((long)pvVar19 + lVar21 + lVar27);
              auVar3 = *(undefined1 (*) [32])((long)pvVar19 + lVar21 + lVar17);
              auVar4 = vunpcklps_avx(auVar2,auVar45);
              auVar45 = vunpckhps_avx(auVar2,auVar45);
              auVar2 = vunpcklps_avx(auVar46,auVar3);
              auVar46 = vunpckhps_avx(auVar46,auVar3);
              auVar3 = vunpcklpd_avx(auVar4,auVar2);
              auVar2 = vunpckhpd_avx(auVar4,auVar2);
              auVar4 = vunpcklpd_avx(auVar45,auVar46);
              auVar45 = vunpckhpd_avx(auVar45,auVar46);
              auVar46._16_16_ = auVar2._0_16_;
              auVar46._0_16_ = auVar3._0_16_;
              auVar47._16_16_ = auVar45._0_16_;
              auVar47._0_16_ = auVar4._0_16_;
              auVar2 = vperm2f128_avx(auVar3,auVar2,0x31);
              auVar45 = vperm2f128_avx(auVar4,auVar45,0x31);
              *pauVar18 = auVar46;
              pauVar18[1] = auVar47;
              pauVar18[2] = auVar2;
              pauVar18[3] = auVar45;
              lVar21 = lVar21 + 0x20;
              iVar22 = iVar22 + 8;
              pMVar15 = (Mat *)(pauVar18 + 4);
            } while (iVar22 < max_kk);
            AT = (Mat *)&pMVar23[1].c;
            lVar25 = lVar21 + lVar17;
            lVar31 = lVar21 + lVar27;
            lVar39 = lVar21 + lVar40;
            lVar21 = lVar21 + lVar41;
            uVar43 = max_kk & 0xfffffff8;
          }
          lVar39 = (long)pvVar19 + lVar39;
          lVar31 = (long)pvVar19 + lVar31;
          lVar25 = (long)pvVar19 + lVar25;
          lVar21 = (long)pvVar19 + lVar21;
          if ((int)(uVar43 | 3) < max_kk) {
            lVar32 = 0;
            pMVar15 = AT;
            uVar34 = uVar43;
            do {
              pMVar23 = pMVar15;
              auVar10 = vunpcklps_avx(*(undefined1 (*) [16])(lVar21 + lVar32),
                                      *(undefined1 (*) [16])(lVar39 + lVar32));
              auVar11 = vunpcklps_avx(*(undefined1 (*) [16])(lVar31 + lVar32),
                                      *(undefined1 (*) [16])(lVar25 + lVar32));
              auVar8 = vunpckhps_avx(*(undefined1 (*) [16])(lVar21 + lVar32),
                                     *(undefined1 (*) [16])(lVar39 + lVar32));
              auVar9 = vunpckhps_avx(*(undefined1 (*) [16])(lVar31 + lVar32),
                                     *(undefined1 (*) [16])(lVar25 + lVar32));
              auVar7 = vmovlhps_avx(auVar10,auVar11);
              auVar11 = vunpckhpd_avx(auVar10,auVar11);
              auVar10 = vmovlhps_avx(auVar8,auVar9);
              auVar8 = vunpckhpd_avx(auVar8,auVar9);
              pMVar15 = (Mat *)((long)&AT->cstep + lVar32 * 4);
              pMVar15[-1].refcount = (int *)auVar7._0_8_;
              pMVar15[-1].elemsize = auVar7._8_8_;
              pMVar15[-1].elempack = auVar11._0_4_;
              *(int *)&pMVar15[-1].field_0x1c = auVar11._4_4_;
              pMVar15[-1].allocator = (Allocator *)auVar11._8_8_;
              pMVar15[-1].dims = auVar10._0_4_;
              pMVar15[-1].w = auVar10._4_4_;
              pMVar15[-1].h = auVar10._8_4_;
              pMVar15[-1].d = auVar10._12_4_;
              pMVar15[-1].c = auVar8._0_4_;
              *(int *)&pMVar15[-1].field_0x3c = auVar8._4_4_;
              pMVar15[-1].cstep = auVar8._8_8_;
              uVar43 = uVar34 + 4;
              lVar32 = lVar32 + 0x10;
              iVar22 = uVar34 + 7;
              uVar34 = uVar43;
            } while (iVar22 < max_kk);
            AT = (Mat *)&pMVar23->cstep;
            lVar25 = lVar25 + lVar32;
            lVar31 = lVar31 + lVar32;
            lVar39 = lVar39 + lVar32;
            lVar21 = lVar21 + lVar32;
          }
          if ((int)uVar43 < max_kk) {
            lVar32 = 0;
            do {
              *(undefined4 *)&AT->data = *(undefined4 *)(lVar21 + lVar32 * 4);
              *(undefined4 *)((long)&AT->data + 4) = *(undefined4 *)(lVar39 + lVar32 * 4);
              *(undefined4 *)&AT->refcount = *(undefined4 *)(lVar31 + lVar32 * 4);
              *(undefined4 *)((long)&AT->refcount + 4) = *(undefined4 *)(lVar25 + lVar32 * 4);
              AT = (Mat *)&AT->elemsize;
              lVar32 = lVar32 + 1;
            } while (max_kk - uVar43 != (int)lVar32);
          }
        }
      }
      uVar30 = uVar26 + 4;
      lVar25 = uVar26 + 7;
      lVar17 = lVar17 + lVar24;
      lVar27 = lVar27 + lVar24;
      lVar40 = lVar40 + lVar24;
      lVar41 = lVar41 + lVar24;
      uVar26 = uVar30;
    } while (lVar25 < lVar28);
  }
  if ((int)((uint)uVar30 | 1) < max_ii) {
    uVar26 = uVar30 & 0xffffffff;
    lVar17 = lVar35 * 4 + (lVar38 + uVar26 + 1) * lVar37 * 4;
    lVar27 = lVar35 * 4 + (lVar38 + uVar26) * lVar37 * 4;
    do {
      pvVar19 = A->data;
      if (max_kk < 8) {
        lVar41 = lVar35 * 4 + (uVar26 + lVar38) * lVar37 * 4;
        lVar40 = lVar35 * 4 + (uVar26 + lVar38 + 1) * lVar37 * 4;
        uVar43 = 0;
      }
      else {
        iVar33 = 7;
        lVar41 = 0;
        pMVar15 = AT;
        do {
          pMVar23 = pMVar15;
          auVar2 = *(undefined1 (*) [32])((long)pvVar19 + lVar41 + lVar27);
          auVar45 = *(undefined1 (*) [32])((long)pvVar19 + lVar41 + lVar17);
          auVar46 = vunpcklps_avx(auVar2,auVar45);
          auVar2 = vunpckhps_avx(auVar2,auVar45);
          auVar45._16_16_ = auVar2._0_16_;
          auVar45._0_16_ = auVar46._0_16_;
          auVar2 = vperm2f128_avx(auVar46,auVar2,0x31);
          pauVar18 = (undefined1 (*) [32])((long)&AT->data + lVar41 * 2);
          *pauVar18 = auVar45;
          pauVar18[1] = auVar2;
          lVar41 = lVar41 + 0x20;
          iVar33 = iVar33 + 8;
          pMVar15 = (Mat *)(pauVar18 + 2);
        } while (iVar33 < max_kk);
        AT = (Mat *)&pMVar23->cstep;
        lVar40 = lVar41 + lVar17;
        lVar41 = lVar41 + lVar27;
        uVar43 = max_kk & 0xfffffff8;
      }
      pauVar42 = (undefined1 (*) [16])((long)pvVar19 + lVar41);
      pauVar29 = (undefined1 (*) [16])((long)pvVar19 + lVar40);
      uVar34 = uVar43 | 3;
      while ((int)uVar34 < max_kk) {
        auVar10 = vunpcklps_avx(*pauVar42,*pauVar29);
        auVar7 = vunpckhps_avx(*pauVar42,*pauVar29);
        AT->data = (void *)auVar10._0_8_;
        AT->refcount = (int *)auVar10._8_8_;
        AT->elemsize = auVar7._0_8_;
        AT->elempack = auVar7._8_4_;
        *(int *)&AT->field_0x1c = auVar7._12_4_;
        AT = (Mat *)&AT->allocator;
        pauVar42 = pauVar42 + 1;
        pauVar29 = pauVar29 + 1;
        uVar34 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar40 = 0;
        do {
          *(undefined4 *)&AT->data = *(undefined4 *)(*pauVar42 + lVar40 * 4);
          *(undefined4 *)((long)&AT->data + 4) = *(undefined4 *)(*pauVar29 + lVar40 * 4);
          AT = (Mat *)&AT->refcount;
          lVar40 = lVar40 + 1;
        } while (max_kk - uVar43 != (int)lVar40);
      }
      uVar30 = uVar26 + 2;
      lVar40 = uVar26 + 3;
      lVar17 = lVar17 + lVar37 * 8;
      lVar27 = lVar27 + lVar37 * 8;
      uVar26 = uVar30;
    } while (lVar40 < lVar28);
  }
  if ((int)uVar30 < max_ii) {
    lVar17 = (long)(int)uVar30;
    do {
      pauVar18 = (undefined1 (*) [32])((long)A->data + lVar35 * 4 + (lVar17 + lVar38) * lVar37 * 4);
      if (max_kk < 8) {
        uVar43 = 0;
      }
      else {
        iVar33 = 7;
        do {
          *(undefined1 (*) [32])AT = *pauVar18;
          AT = (Mat *)&AT->allocator;
          pauVar18 = pauVar18 + 1;
          iVar33 = iVar33 + 8;
          uVar43 = max_kk & 0xfffffff8;
        } while (iVar33 < max_kk);
      }
      uVar34 = uVar43 | 3;
      while ((int)uVar34 < max_kk) {
        uVar14 = *(undefined8 *)((long)pauVar18 + 8);
        AT->data = (void *)*(undefined8 *)((long)pauVar18 + 0);
        AT->refcount = (int *)uVar14;
        AT = (Mat *)&AT->elemsize;
        pauVar18 = (undefined1 (*) [32])(*pauVar18 + 0x10);
        uVar34 = uVar43 + 7;
        uVar43 = uVar43 + 4;
      }
      if ((int)uVar43 < max_kk) {
        lVar40 = 0;
        lVar27 = 0;
        do {
          *(undefined4 *)((long)&AT->data + lVar27 * 4) = *(undefined4 *)(*pauVar18 + lVar27 * 4);
          lVar27 = lVar27 + 1;
          lVar40 = lVar40 + -4;
        } while (max_kk - uVar43 != (int)lVar27);
        AT = (Mat *)((long)AT - lVar40);
      }
      lVar17 = lVar17 + 1;
    } while (lVar17 != lVar28);
  }
  return;
}

Assistant:

static void pack_A_tile(const Mat& A, Mat& AT, int i, int max_ii, int k, int max_kk)
{
    const int elempack = A.elempack;
    const int A_hstep = A.dims == 3 ? (int)A.cstep : A.w;

    float* pp = AT;

    int ii = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; ii + 15 < max_ii; ii += 16)
    {
        if (elempack == 16)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 16;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm512_store_ps(pp, _mm512_load_ps(p0));
                pp += 16;
                p0 += 16;
            }
        }
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;
            const float* p1 = (const float*)A + (i + ii + 8) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                _mm256_store_ps(pp + 8, _mm256_load_ps(p1));
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;
            const float* p2 = (const float*)A + (i + ii + 8) * A_hstep + k * 4;
            const float* p3 = (const float*)A + (i + ii + 12) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                _mm_store_ps(pp + 8, _mm_load_ps(p2));
                _mm_store_ps(pp + 12, _mm_load_ps(p3));
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;
            const float* p8 = (const float*)A + (i + ii + 8) * A_hstep + k;
            const float* p9 = (const float*)A + (i + ii + 9) * A_hstep + k;
            const float* pa = (const float*)A + (i + ii + 10) * A_hstep + k;
            const float* pb = (const float*)A + (i + ii + 11) * A_hstep + k;
            const float* pc = (const float*)A + (i + ii + 12) * A_hstep + k;
            const float* pd = (const float*)A + (i + ii + 13) * A_hstep + k;
            const float* pe = (const float*)A + (i + ii + 14) * A_hstep + k;
            const float* pf = (const float*)A + (i + ii + 15) * A_hstep + k;

            int kk = 0;
            for (; kk + 15 < max_kk; kk += 16)
            {
                __m512 _r0 = _mm512_loadu_ps(p0);
                __m512 _r1 = _mm512_loadu_ps(p1);
                __m512 _r2 = _mm512_loadu_ps(p2);
                __m512 _r3 = _mm512_loadu_ps(p3);
                __m512 _r4 = _mm512_loadu_ps(p4);
                __m512 _r5 = _mm512_loadu_ps(p5);
                __m512 _r6 = _mm512_loadu_ps(p6);
                __m512 _r7 = _mm512_loadu_ps(p7);
                __m512 _r8 = _mm512_loadu_ps(p8);
                __m512 _r9 = _mm512_loadu_ps(p9);
                __m512 _ra = _mm512_loadu_ps(pa);
                __m512 _rb = _mm512_loadu_ps(pb);
                __m512 _rc = _mm512_loadu_ps(pc);
                __m512 _rd = _mm512_loadu_ps(pd);
                __m512 _re = _mm512_loadu_ps(pe);
                __m512 _rf = _mm512_loadu_ps(pf);
                transpose16x16_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7, _r8, _r9, _ra, _rb, _rc, _rd, _re, _rf);
                _mm512_store_ps(pp, _r0);
                _mm512_store_ps(pp + 16, _r1);
                _mm512_store_ps(pp + 16 * 2, _r2);
                _mm512_store_ps(pp + 16 * 3, _r3);
                _mm512_store_ps(pp + 16 * 4, _r4);
                _mm512_store_ps(pp + 16 * 5, _r5);
                _mm512_store_ps(pp + 16 * 6, _r6);
                _mm512_store_ps(pp + 16 * 7, _r7);
                _mm512_store_ps(pp + 16 * 8, _r8);
                _mm512_store_ps(pp + 16 * 9, _r9);
                _mm512_store_ps(pp + 16 * 10, _ra);
                _mm512_store_ps(pp + 16 * 11, _rb);
                _mm512_store_ps(pp + 16 * 12, _rc);
                _mm512_store_ps(pp + 16 * 13, _rd);
                _mm512_store_ps(pp + 16 * 14, _re);
                _mm512_store_ps(pp + 16 * 15, _rf);
                pp += 256;
                p0 += 16;
                p1 += 16;
                p2 += 16;
                p3 += 16;
                p4 += 16;
                p5 += 16;
                p6 += 16;
                p7 += 16;
                p8 += 16;
                p9 += 16;
                pa += 16;
                pb += 16;
                pc += 16;
                pd += 16;
                pe += 16;
                pf += 16;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp[8] = p8[0];
                pp[9] = p9[0];
                pp[10] = pa[0];
                pp[11] = pb[0];
                pp[12] = pc[0];
                pp[13] = pd[0];
                pp[14] = pe[0];
                pp[15] = pf[0];
                pp += 16;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
                p8++;
                p9++;
                pa++;
                pb++;
                pc++;
                pd++;
                pe++;
                pf++;
            }
        }
    }
#endif // __AVX512F__
    for (; ii + 7 < max_ii; ii += 8)
    {
        if (elempack == 8)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 8;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm256_store_ps(pp, _mm256_load_ps(p0));
                pp += 8;
                p0 += 8;
            }
        }
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;
            const float* p1 = (const float*)A + (i + ii + 4) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                _mm_store_ps(pp + 4, _mm_load_ps(p1));
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;
            const float* p4 = (const float*)A + (i + ii + 4) * A_hstep + k;
            const float* p5 = (const float*)A + (i + ii + 5) * A_hstep + k;
            const float* p6 = (const float*)A + (i + ii + 6) * A_hstep + k;
            const float* p7 = (const float*)A + (i + ii + 7) * A_hstep + k;

            int kk = 0;
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                __m256 _r4 = _mm256_loadu_ps(p4);
                __m256 _r5 = _mm256_loadu_ps(p5);
                __m256 _r6 = _mm256_loadu_ps(p6);
                __m256 _r7 = _mm256_loadu_ps(p7);
                transpose8x8_ps(_r0, _r1, _r2, _r3, _r4, _r5, _r6, _r7);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 8 * 2, _r2);
                _mm256_store_ps(pp + 8 * 3, _r3);
                _mm256_store_ps(pp + 8 * 4, _r4);
                _mm256_store_ps(pp + 8 * 5, _r5);
                _mm256_store_ps(pp + 8 * 6, _r6);
                _mm256_store_ps(pp + 8 * 7, _r7);
                pp += 64;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
                p4 += 8;
                p5 += 8;
                p6 += 8;
                p7 += 8;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp[4] = p4[0];
                pp[5] = p5[0];
                pp[6] = p6[0];
                pp[7] = p7[0];
                pp += 8;
                p0++;
                p1++;
                p2++;
                p3++;
                p4++;
                p5++;
                p6++;
                p7++;
            }
        }
    }
#endif // __AVX__
    for (; ii + 3 < max_ii; ii += 4)
    {
        if (elempack == 4)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k * 4;

            for (int kk = 0; kk < max_kk; kk++)
            {
                _mm_store_ps(pp, _mm_load_ps(p0));
                pp += 4;
                p0 += 4;
            }
        }
        if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;
            const float* p2 = (const float*)A + (i + ii + 2) * A_hstep + k;
            const float* p3 = (const float*)A + (i + ii + 3) * A_hstep + k;

            int kk = 0;
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                __m256 _r2 = _mm256_loadu_ps(p2);
                __m256 _r3 = _mm256_loadu_ps(p3);
                transpose8x4_ps(_r0, _r1, _r2, _r3);
                _mm256_store_ps(pp, _r0);
                _mm256_store_ps(pp + 8, _r1);
                _mm256_store_ps(pp + 16, _r2);
                _mm256_store_ps(pp + 24, _r3);
                pp += 32;
                p0 += 8;
                p1 += 8;
                p2 += 8;
                p3 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _r2 = _mm_loadu_ps(p2);
                __m128 _r3 = _mm_loadu_ps(p3);
                _MM_TRANSPOSE4_PS(_r0, _r1, _r2, _r3);
                _mm_store_ps(pp, _r0);
                _mm_store_ps(pp + 4, _r1);
                _mm_store_ps(pp + 8, _r2);
                _mm_store_ps(pp + 12, _r3);
                pp += 16;
                p0 += 4;
                p1 += 4;
                p2 += 4;
                p3 += 4;
            }
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp[2] = p2[0];
                pp[3] = p3[0];
                pp += 4;
                p0++;
                p1++;
                p2++;
                p3++;
            }
        }
    }
#endif // __SSE2__
    for (; ii + 1 < max_ii; ii += 2)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;
            const float* p1 = (const float*)A + (i + ii + 1) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                __m256 _r0 = _mm256_loadu_ps(p0);
                __m256 _r1 = _mm256_loadu_ps(p1);
                transpose8x2_ps(_r0, _r1);
                _mm256_storeu_ps(pp, _r0);
                _mm256_storeu_ps(pp + 8, _r1);
                pp += 16;
                p0 += 8;
                p1 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                __m128 _r0 = _mm_loadu_ps(p0);
                __m128 _r1 = _mm_loadu_ps(p1);
                __m128 _tmp0 = _mm_unpacklo_ps(_r0, _r1);
                __m128 _tmp1 = _mm_unpackhi_ps(_r0, _r1);
                _mm_store_ps(pp, _tmp0);
                _mm_store_ps(pp + 4, _tmp1);
                pp += 8;
                p0 += 4;
                p1 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp[1] = p1[0];
                pp += 2;
                p0++;
                p1++;
            }
        }
    }
    for (; ii < max_ii; ii += 1)
    {
        // if (elempack == 1)
        {
            const float* p0 = (const float*)A + (i + ii) * A_hstep + k;

            int kk = 0;
#if __SSE2__
#if __AVX__
            for (; kk + 7 < max_kk; kk += 8)
            {
                _mm256_storeu_ps(pp, _mm256_loadu_ps(p0));
                pp += 8;
                p0 += 8;
            }
#endif // __AVX__
            for (; kk + 3 < max_kk; kk += 4)
            {
                _mm_storeu_ps(pp, _mm_loadu_ps(p0));
                pp += 4;
                p0 += 4;
            }
#endif // __SSE2__
            for (; kk < max_kk; kk++)
            {
                pp[0] = p0[0];
                pp += 1;
                p0++;
            }
        }
    }
}